

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O0

void __thiscall QLinuxFbDevice::createFramebuffers(QLinuxFbDevice *this)

{
  bool bVar1;
  iterator o;
  Output *pOVar2;
  long in_FS_OFFSET;
  int i;
  Output *output;
  QList<QLinuxFbDevice::Output> *__range1;
  iterator __end1;
  iterator __begin1;
  QLinuxFbDevice *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (Output *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QLinuxFbDevice::Output>::begin
                       ((QList<QLinuxFbDevice::Output> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  o = QList<QLinuxFbDevice::Output>::end
                ((QList<QLinuxFbDevice::Output> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  while (bVar1 = QList<QLinuxFbDevice::Output>::iterator::operator!=(&local_10,o), bVar1) {
    pOVar2 = QList<QLinuxFbDevice::Output>::iterator::operator*(&local_10);
    for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
      bVar1 = createFramebuffer(in_stack_00000040,__begin1.i,__end1.i._4_4_);
      if (!bVar1) goto LAB_0011dd1f;
    }
    pOVar2->backFb = 0;
    pOVar2->flipped = false;
    QList<QLinuxFbDevice::Output>::iterator::operator++(&local_10);
  }
LAB_0011dd1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLinuxFbDevice::createFramebuffers()
{
    for (Output &output : m_outputs) {
        for (int i = 0; i < BUFFER_COUNT; ++i) {
            if (!createFramebuffer(&output, i))
                return;
        }
        output.backFb = 0;
        output.flipped = false;
    }
}